

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInitializers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  ImmutableFieldGenerator *pIVar1;
  Descriptor *pDVar2;
  long lVar3;
  long lVar4;
  
  pDVar2 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar2 + 0x2c)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      if (*(long *)(*(long *)(pDVar2 + 0x30) + 0x60 + lVar3) == 0) {
        pIVar1 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar3));
        (*pIVar1->_vptr_ImmutableFieldGenerator[7])(pIVar1,printer);
        pDVar2 = (this->super_MessageGenerator).descriptor_;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xa8;
    } while (lVar4 < *(int *)(pDVar2 + 0x2c));
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInitializers(io::Printer* printer) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitializationCode(printer);
    }
  }
}